

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void my_sighandler(int signum)

{
  int signum_local;
  
  if (signum == 2) {
    log_log(0x40,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
            ,0x97,"Received SIGINT");
  }
  else if (signum == 0xf) {
    log_log(0x40,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
            ,0x9a,"Received SIGTERM");
  }
  if ((signum == 0xf) || (signum == 2)) {
    G_app_ctx_ptr->should_terminate = true;
    (G_app_ctx_ptr->pool).aborted = true;
  }
  return;
}

Assistant:

static void my_sighandler(int signum) {
    switch (signum) {
    case SIGINT:
        log_warn("Received SIGINT");
        break;
    case SIGTERM:
        log_warn("Received SIGTERM");
        break;
    default:
        break;
    }
    if (signum == SIGTERM || signum == SIGINT) {
        G_app_ctx_ptr->should_terminate = true;
        G_app_ctx_ptr->pool.aborted = true;
    }
}